

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_compress.hpp
# Opt level: O3

void __thiscall
duckdb::AlpCompressionState<double>::CompressVector(AlpCompressionState<double> *this)

{
  atomic<unsigned_long> *paVar1;
  idx_t iVar2;
  __int_type _Var3;
  idx_t i;
  ulong uVar4;
  idx_t iVar5;
  pointer pCVar6;
  ulong uVar7;
  idx_t i_1;
  double dVar8;
  
  iVar2 = this->nulls_idx;
  if (iVar2 == 0) {
    uVar7 = this->vector_idx;
  }
  else {
    uVar7 = this->vector_idx;
    dVar8 = 0.0;
    if (uVar7 != 0) {
      uVar4 = 0;
      do {
        if (uVar4 != this->vector_null_positions[uVar4]) {
          dVar8 = this->input_vector[uVar4];
          break;
        }
        uVar4 = uVar4 + 1;
      } while (uVar7 != uVar4);
    }
    iVar5 = 0;
    do {
      this->input_vector[this->vector_null_positions[iVar5]] = dVar8;
      iVar5 = iVar5 + 1;
    } while (iVar2 != iVar5);
  }
  alp::AlpCompression<double,_false>::Compress
            (this->input_vector,uVar7,this->vector_null_positions,iVar2,&this->state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  if (this->metadata_ptr + -4 <=
      ((this->handle).node.ptr)->buffer +
      (this->data_bytes_used + (this->state).bp_size + (ulong)(this->state).exceptions_count * 10 +
       0x18 & 0xfffffffffffffff8)) {
    pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    iVar2 = (pCVar6->super_SegmentBase<duckdb::ColumnSegment>).start;
    pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    _Var3 = (pCVar6->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i;
    FlushSegment(this);
    CreateEmptySegment(this,_Var3 + iVar2);
  }
  uVar7 = this->vector_idx;
  if (uVar7 != 0 && uVar7 != this->nulls_idx) {
    uVar4 = 0;
    do {
      pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->current_segment);
      BaseStatistics::UpdateNumericStats<double>
                (&(pCVar6->stats).statistics,this->input_vector[uVar4]);
      uVar4 = uVar4 + 1;
      uVar7 = this->vector_idx;
    } while (uVar4 < uVar7);
  }
  pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  LOCK();
  paVar1 = &(pCVar6->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + uVar7;
  UNLOCK();
  FlushVector(this);
  return;
}

Assistant:

void CompressVector() {
		if (nulls_idx) {
			alp::AlpUtils::FindAndReplaceNullsInVector<T>(input_vector, vector_null_positions, vector_idx, nulls_idx);
		}
		alp::AlpCompression<T, false>::Compress(input_vector, vector_idx, vector_null_positions, nulls_idx, state);
		//! Check if the compressed vector fits on current segment
		if (!HasEnoughSpace()) {
			auto row_start = current_segment->start + current_segment->count;
			FlushSegment();
			CreateEmptySegment(row_start);
		}

		if (vector_idx != nulls_idx) { //! At least there is one valid value in the vector
			for (idx_t i = 0; i < vector_idx; i++) {
				current_segment->stats.statistics.UpdateNumericStats<T>(input_vector[i]);
			}
		}
		current_segment->count += vector_idx;
		FlushVector();
	}